

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_scene.hpp
# Opt level: O0

hit_list<double> * mesh_scene(void)

{
  hit_list<double> *in_RDI;
  hit_list<double> *objects;
  shared_ptr<hit<double>_> *in_stack_ffffffffffffff08;
  shared_ptr<diffuse_light<double>_> *obj;
  hit_list<double> *in_stack_ffffffffffffff10;
  hit_list<double> *__args;
  int *in_stack_ffffffffffffff40;
  vec3<double> *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  shared_ptr<diffuse_light<double>_> *in_stack_ffffffffffffff80;
  vec3<double> local_48 [2];
  undefined1 local_9;
  
  local_9 = 0;
  __args = in_RDI;
  hit_list<double>::hit_list(in_stack_ffffffffffffff10);
  vec3<double>::vec3(local_48,0.0,-1000.0,0.0);
  std::make_shared<diffuse<double>,std::shared_ptr<checker<double>>&>
            ((shared_ptr<checker<double>_> *)__args);
  std::make_shared<sphere<double>,vec3<double>,int,std::shared_ptr<diffuse<double>>>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (shared_ptr<diffuse<double>_> *)__args);
  std::shared_ptr<hit<double>>::shared_ptr<sphere<double>,void>
            ((shared_ptr<hit<double>_> *)in_stack_ffffffffffffff10,
             (shared_ptr<sphere<double>_> *)in_stack_ffffffffffffff08);
  hit_list<double>::add(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::shared_ptr<hit<double>_>::~shared_ptr((shared_ptr<hit<double>_> *)0x104d86);
  std::shared_ptr<sphere<double>_>::~shared_ptr((shared_ptr<sphere<double>_> *)0x104d93);
  std::shared_ptr<diffuse<double>_>::~shared_ptr((shared_ptr<diffuse<double>_> *)0x104da0);
  obj = &light;
  std::
  make_shared<xz_rectangle<double>,int,int,int,int,double,std::shared_ptr<diffuse_light<double>>&>
            ((int *)0xfffffeb40000014c,(int *)0x408125999999999a,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48->e,in_stack_ffffffffffffff80);
  std::shared_ptr<hit<double>>::shared_ptr<xz_rectangle<double>,void>
            ((shared_ptr<hit<double>_> *)in_stack_ffffffffffffff10,
             (shared_ptr<xz_rectangle<double>_> *)obj);
  hit_list<double>::add(in_stack_ffffffffffffff10,(shared_ptr<hit<double>_> *)obj);
  std::shared_ptr<hit<double>_>::~shared_ptr((shared_ptr<hit<double>_> *)0x104e36);
  std::shared_ptr<xz_rectangle<double>_>::~shared_ptr((shared_ptr<xz_rectangle<double>_> *)0x104e40)
  ;
  std::make_shared<mesh<double>,char_const(&)[10],std::shared_ptr<diffuse<double>>&>
            ((char (*) [10])__args,(shared_ptr<diffuse<double>_> *)in_RDI);
  std::shared_ptr<hit<double>>::shared_ptr<mesh<double>,void>
            ((shared_ptr<hit<double>_> *)in_stack_ffffffffffffff10,(shared_ptr<mesh<double>_> *)obj)
  ;
  hit_list<double>::add(in_stack_ffffffffffffff10,(shared_ptr<hit<double>_> *)obj);
  std::shared_ptr<hit<double>_>::~shared_ptr((shared_ptr<hit<double>_> *)0x104e89);
  std::shared_ptr<mesh<double>_>::~shared_ptr((shared_ptr<mesh<double>_> *)0x104e93);
  return __args;
}

Assistant:

hit_list<datatype> mesh_scene() {
  hit_list<datatype> objects;

  objects.add(std::make_shared<sphere<datatype>>(
      point3<datatype>(0, -1000, 0), 1000,
      std::make_shared<diffuse<datatype>>(mat_checker)));

  objects.add(std::make_shared<xz_rectangle<datatype>>(-343, 343, -332, 332,
                                                       548.7, light));
  objects.add(std::make_shared<mesh<datatype>>("bunny.obj", red));

  return objects;
}